

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall
CMU462::DynamicScene::Mesh::drag
          (Mesh *this,double x,double y,double dx,double dy,Matrix4x4 *modelViewProj)

{
  Vector4D *in_RDI;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double w;
  Vector4D q;
  Matrix4x4 *in_stack_000007e8;
  Vector4D *in_stack_fffffffffffffed0;
  double local_128;
  double local_120;
  Matrix4x4 *local_78;
  double local_70;
  double local_68;
  Vector4D *local_60;
  Matrix4x4 *local_58;
  double local_50;
  double local_48;
  Vector4D *in_stack_ffffffffffffffc0;
  Matrix4x4 *in_stack_ffffffffffffffc8;
  
  Vector4D::Vector4D((Vector4D *)&local_50,(Vector3D *)&in_RDI->z,1.0);
  Matrix4x4::operator*(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  local_50 = local_70;
  local_48 = local_68;
  local_78 = local_58;
  Vector4D::operator/=(in_stack_fffffffffffffed0,&in_RDI->x);
  local_50 = in_XMM2_Qa + local_50;
  local_48 = in_XMM3_Qa + local_48;
  Vector4D::operator*=((Vector4D *)&local_50,(double *)&local_78);
  Matrix4x4::inv(in_stack_000007e8);
  Matrix4x4::operator*(local_58,local_60);
  Vector4D::to3D(in_RDI);
  in_RDI->z = (double)in_stack_fffffffffffffed0;
  in_RDI->w = local_128;
  in_RDI[1].x = local_120;
  return;
}

Assistant:

void Mesh::drag(double x, double y, double dx, double dy,
                const Matrix4x4 &modelViewProj) {
  Vector4D q(position, 1.);

  // Transform into clip space
  q = modelViewProj * q;
  double w = q.w;
  q /= w;

  // Shift by (dx, dy).
  q.x += dx;
  q.y += dy;

  // Transform back into model space
  q *= w;
  q = modelViewProj.inv() * q;

  position = q.to3D();
}